

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::SubroutineIndexNegativeLinkMaxNumOfIndices::
~SubroutineIndexNegativeLinkMaxNumOfIndices(SubroutineIndexNegativeLinkMaxNumOfIndices *this)

{
  deqp::SubcaseBase::~SubcaseBase((SubcaseBase *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual long Run()
	{
		//subroutine vec4 st0(float param);
		SubroutineFunctionSet functions_st0(uniformValueGenerator);

		glw::GLint max;
		glGetIntegerv(GL_MAX_SUBROUTINES, &max);

		for (int i = 0; i < max; i++)
		{
			//layout(index = N) subroutine(st0) vec4 sf0(float param) { .... };
			functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::C(i)));
		}
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::Implicit()));

		std::vector<SubroutineUniform> subroutineUniforms;

		//subroutine uniform st0 u0;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::Implicit(), 0, DefOccurence::FSH_OR_CSH));
		return doRunNegativeLink(subroutineUniforms);
	}